

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icosahedralBuilder.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  char *__s;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  size_type sVar5;
  int iVar6;
  SimInfo *pSVar7;
  Icosahedron *this;
  Decahedron *pDVar8;
  CurlingStoneDecahedron *this_00;
  MoLocator *this_01;
  Molecule *mol;
  DumpWriter *this_02;
  TruncatedCube *this_03;
  RegularCuboctahedron *this_04;
  uint i;
  long lVar9;
  pointer pVVar10;
  ulong uVar11;
  ulong uVar12;
  Vector<double,_3U> result;
  Mat3x3d boundingBox;
  SimCreator newCreator;
  Vector3d boxMin;
  Vector3d boxMax;
  string outputFileName;
  string inputFileName;
  SimCreator oldCreator;
  Vector<double,_3U> result_1;
  MoleculeIterator mi;
  gengetopt_args_info args_info;
  pointer local_360;
  pointer local_348;
  pointer pVStack_340;
  Vector3d local_338;
  undefined1 local_318 [16];
  undefined1 local_308 [8];
  double dStack_300;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  double local_2d8;
  double local_2d0;
  SimCreator local_2c8;
  undefined1 local_298 [16];
  double local_288;
  undefined1 local_278 [16];
  double local_268;
  string local_260;
  string local_240;
  SimCreator local_220;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [16];
  undefined8 local_1a8;
  MoleculeIterator local_198;
  gengetopt_args_info local_190;
  
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  local_240._M_string_length = 0;
  local_240.field_2._M_local_buf[0] = '\0';
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  local_260._M_string_length = 0;
  local_260.field_2._M_local_buf[0] = '\0';
  iVar6 = cmdline_parser(argc,argv,&local_190);
  sVar5 = local_240._M_string_length;
  if (iVar6 != 0) {
    exit(1);
  }
  if (local_190.inputs_num == 0) {
    builtin_strncpy(painCave.errMsg + 0x31,"and line",9);
    builtin_strncpy(painCave.errMsg + 0x20,"ified on the comm",0x11);
    builtin_strncpy(painCave.errMsg + 0x10,"le name was spec",0x10);
    builtin_strncpy(painCave.errMsg,"No input .omd fi",0x10);
    painCave.isFatal = 1;
    cmdline_parser_print_help();
    simError();
  }
  else {
    __s = *local_190.inputs;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_240,0,(char *)sVar5,(ulong)__s);
  }
  if (((local_190.shells_given == 0) && (local_190.cuboctahedron_given == 0)) &&
     (local_190.truncatedCube_given == 0)) {
    memcpy(&painCave,
           "icosahedralBuilder:  The number of shells\n\tis required to build a Mackay Icosahedron."
           ,0x56);
    painCave.isFatal = 1;
    cmdline_parser_print_help();
    simError();
    iVar6 = -1;
  }
  else {
    iVar6 = local_190.shells_arg;
    if (local_190.shells_arg < 0) {
      memcpy(&painCave,
             "icosahedralBuilder:  The number of shells\n\tmust be greater than or equal to zero.",
             0x52);
      painCave.isFatal = 1;
      cmdline_parser_print_help();
      simError();
    }
  }
  if (local_190.latticeConstant_given == 0) {
    builtin_strncpy(painCave.errMsg,"icosahedralBuilder:  No lattice constant\n\tgiven.",0x31);
    painCave.isFatal = 1;
    cmdline_parser_print_help();
    local_2d0 = 0.0;
    simError();
  }
  else {
    local_2d0 = local_190.latticeConstant_arg;
  }
  local_220.mdFileName_._M_dataplus._M_p = (pointer)&local_220.mdFileName_.field_2;
  local_220._vptr_SimCreator = (_func_int **)&PTR__SimCreator_0022af28;
  local_220.mdFileName_._M_string_length = 0;
  local_220.mdFileName_.field_2._M_local_buf[0] = '\0';
  pSVar7 = OpenMD::SimCreator::createSim(&local_220,&local_240,false);
  if (local_190.ico_given == 0) {
    if (local_190.deca_given == 0) {
      if (local_190.ino_given == 0) {
        if (local_190.marks_given == 0) {
          if (local_190.stone_given == 0) {
            if (local_190.truncatedCube_given == 0 && local_190.cuboctahedron_given == 0) {
              local_348 = (pointer)0x0;
              pVStack_340 = (pointer)0x0;
              local_360 = (pointer)0x0;
            }
            else {
              local_318._8_8_ = 0;
              local_318._0_8_ = (pointer)local_308;
              auVar4[0xf] = 0;
              auVar4._0_15_ = stack0xfffffffffffffcf9;
              _local_308 = auVar4 << 8;
              if (local_190.lattice_given == 0) {
                builtin_strncpy(painCave.errMsg + 0x20,"ype given.",0xb);
                builtin_strncpy(painCave.errMsg + 0x10,"er: No lattice t",0x10);
                builtin_strncpy(painCave.errMsg,"icosahedralBuild",0x10);
                painCave.isFatal = 1;
                cmdline_parser_print_help();
                simError();
              }
              else {
                std::__cxx11::string::operator=((string *)local_318,local_190.lattice_arg);
              }
              iVar6 = local_190.unitCells_arg;
              if (local_190.unitCells_given == 0) {
                builtin_strncpy(painCave.errMsg + 0x20," unit cells.",0xd);
                builtin_strncpy(painCave.errMsg + 0x10,"er: Must specify",0x10);
                builtin_strncpy(painCave.errMsg,"icosahedralBuild",0x10);
                painCave.isFatal = 1;
                cmdline_parser_print_help();
                simError();
                iVar6 = 0;
              }
              if (local_190.truncatedCube_given == 0) {
                this_04 = (RegularCuboctahedron *)operator_new(0x60);
                local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1f8,local_318._0_8_,
                           (long)((Vector<double,_3U> *)local_318._8_8_)->data_ +
                           (long)((Vector<double,_3U> *)local_318._0_8_)->data_);
                OpenMD::RegularCuboctahedron::RegularCuboctahedron(this_04,&local_1f8,iVar6);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                (*(this_04->super_Cuboctahedron)._vptr_Cuboctahedron[2])(&local_2c8);
              }
              else {
                this_03 = (TruncatedCube *)operator_new(0x60);
                local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1d8,local_318._0_8_,
                           (long)((Vector<double,_3U> *)local_318._8_8_)->data_ +
                           (long)((Vector<double,_3U> *)local_318._0_8_)->data_);
                OpenMD::TruncatedCube::TruncatedCube
                          (this_03,&local_1d8,iVar6,local_190.truncatedPlanes_arg);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                  operator_delete(local_1d8._M_dataplus._M_p,
                                  local_1d8.field_2._M_allocated_capacity + 1);
                }
                (*(this_03->super_Cuboctahedron)._vptr_Cuboctahedron[2])(&local_2c8);
              }
              local_348 = (pointer)local_2c8._vptr_SimCreator;
              pVStack_340 = (pointer)local_2c8.mdFileName_._M_dataplus._M_p;
              local_360 = (pointer)local_2c8.mdFileName_._M_string_length;
              if ((pointer)local_318._0_8_ != (pointer)local_308) {
                operator_delete((void *)local_318._0_8_,
                                (ulong)((long)((Vector<double,_3U> *)local_308)->data_ + 1));
              }
            }
            goto LAB_00118042;
          }
          this_00 = (CurlingStoneDecahedron *)operator_new(0x50);
          OpenMD::CurlingStoneDecahedron::CurlingStoneDecahedron
                    (this_00,local_190.columnAtoms_arg,iVar6,local_190.twinAtoms_arg,
                     local_190.truncatedPlanes_arg);
          (*(this_00->super_Decahedron)._vptr_Decahedron[2])(local_318);
        }
        else {
          pDVar8 = (Decahedron *)operator_new(0x48);
          OpenMD::Decahedron::Decahedron
                    (pDVar8,local_190.columnAtoms_arg,iVar6,local_190.twinAtoms_arg);
          (*pDVar8->_vptr_Decahedron[2])(local_318);
        }
      }
      else {
        pDVar8 = (Decahedron *)operator_new(0x48);
        OpenMD::Decahedron::Decahedron
                  (pDVar8,local_190.columnAtoms_arg,iVar6,local_190.columnAtoms_arg);
        pDVar8->_vptr_Decahedron = (_func_int **)&PTR__Decahedron_0022a9d0;
        OpenMD::Decahedron::getPoints
                  ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                   local_318,pDVar8);
      }
    }
    else {
      pDVar8 = (Decahedron *)operator_new(0x48);
      OpenMD::Decahedron::Decahedron(pDVar8,iVar6 + -1,iVar6,iVar6);
      pDVar8->_vptr_Decahedron = (_func_int **)&PTR__Decahedron_0022a990;
      OpenMD::Decahedron::getPoints
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 local_318,pDVar8);
    }
  }
  else {
    this = (Icosahedron *)operator_new(0x68);
    OpenMD::Icosahedron::Icosahedron(this);
    OpenMD::Icosahedron::getPoints
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               local_318,this,iVar6);
  }
  local_348 = (pointer)local_318._0_8_;
  pVStack_340 = (pointer)local_318._8_8_;
  local_360 = (pointer)local_308;
LAB_00118042:
  sVar5 = local_260._M_string_length;
  strlen(local_190.output_arg);
  std::__cxx11::string::_M_replace((ulong)&local_260,0,(char *)sVar5,(ulong)local_190.output_arg);
  uVar12 = ((long)pVStack_340 - (long)local_348 >> 3) * -0x5555555555555555;
  createMdFile(&local_240,&local_260,(int)uVar12);
  if (pSVar7 != (SimInfo *)0x0) {
    (*pSVar7->_vptr_SimInfo[1])(pSVar7);
  }
  local_2c8.mdFileName_._M_dataplus._M_p = (pointer)&local_2c8.mdFileName_.field_2;
  local_2c8._vptr_SimCreator = (_func_int **)&PTR__SimCreator_0022af28;
  local_2c8.mdFileName_._M_string_length = 0;
  local_2c8.mdFileName_.field_2._M_local_buf[0] = '\0';
  pSVar7 = OpenMD::SimCreator::createSim(&local_2c8,&local_260,false);
  local_198._M_node = (_Base_ptr)0x0;
  OpenMD::SimInfo::beginMolecule(pSVar7,&local_198);
  this_01 = (MoLocator *)operator_new(0x30);
  OpenMD::MoLocator::MoLocator
            (this_01,*(pSVar7->moleculeStamps_).
                      super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,pSVar7->forceField_);
  local_278 = (undefined1  [16])0x0;
  uVar11 = 0;
  local_268 = 0.0;
  local_288 = 0.0;
  local_298 = (undefined1  [16])0x0;
  if (pVStack_340 != local_348) {
    pVVar10 = local_348;
    do {
      iVar6 = (int)uVar11;
      mol = OpenMD::SimInfo::getMoleculeByGlobalIndex(pSVar7,iVar6);
      local_318 = (undefined1  [16])0x0;
      dVar2 = dStack_300;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = dStack_300;
      _local_308 = auVar3 << 0x40;
      if (local_190.truncatedCube_given == 0 && local_190.cuboctahedron_given == 0) {
        local_1b8 = (undefined1  [16])0x0;
        local_1a8 = 0;
        lVar9 = 0;
        do {
          *(double *)(local_1b8 + lVar9 * 8) =
               (pVVar10->super_Vector<double,_3U>).data_[lVar9] * local_2d0;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        local_338.super_Vector<double,_3U>.data_._0_16_ = ZEXT816(0);
        local_338.super_Vector<double,_3U>.data_[2] = 0.0;
        lVar9 = 0;
        do {
          local_338.super_Vector<double,_3U>.data_[lVar9] =
               *(double *)(local_1b8 + lVar9 * 8) / 1.4142135623730951;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
      }
      else {
        local_338.super_Vector<double,_3U>.data_[0] = 0.0;
        local_338.super_Vector<double,_3U>.data_[1] = 0.0;
        local_338.super_Vector<double,_3U>.data_[2] = 0.0;
        lVar9 = 0;
        do {
          local_338.super_Vector<double,_3U>.data_[lVar9] =
               (pVVar10->super_Vector<double,_3U>).data_[lVar9] * local_2d0;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
      }
      dVar1 = local_338.super_Vector<double,_3U>.data_[2];
      auVar4 = (undefined1  [16])local_338.super_Vector<double,_3U>.data_._0_16_;
      local_308 = (undefined1  [8])local_338.super_Vector<double,_3U>.data_[2];
      _local_308 = CONCAT88(dVar2,local_308);
      local_318._0_8_ = local_338.super_Vector<double,_3U>.data_[0];
      local_318._8_8_ = local_338.super_Vector<double,_3U>.data_[1];
      local_338.super_Vector<double,_3U>.data_._0_16_ = ZEXT816(0);
      auVar3 = (undefined1  [16])local_338.super_Vector<double,_3U>.data_._0_16_;
      local_338.super_Vector<double,_3U>.data_[2] = 1.0;
      if (iVar6 == 0) {
        local_268 = dVar1;
        local_338.super_Vector<double,_3U>.data_[0] = auVar4._0_8_;
        local_338.super_Vector<double,_3U>.data_[1] = auVar4._8_8_;
        local_278._0_8_ = local_338.super_Vector<double,_3U>.data_[0];
        local_278._8_8_ = local_338.super_Vector<double,_3U>.data_[1];
        local_338.super_Vector<double,_3U>.data_[0] = auVar4._0_8_;
        local_338.super_Vector<double,_3U>.data_[1] = auVar4._8_8_;
        local_298._0_8_ = local_338.super_Vector<double,_3U>.data_[0];
        local_298._8_8_ = local_338.super_Vector<double,_3U>.data_[1];
        local_288 = dVar1;
      }
      else {
        lVar9 = 0;
        do {
          dVar1 = *(double *)(local_318 + lVar9 * 8);
          dVar2 = dVar1;
          if (dVar1 <= *(double *)(local_278 + lVar9 * 8)) {
            dVar2 = *(double *)(local_278 + lVar9 * 8);
          }
          if (*(double *)(local_298 + lVar9 * 8) <= dVar1) {
            dVar1 = *(double *)(local_298 + lVar9 * 8);
          }
          *(double *)(local_278 + lVar9 * 8) = dVar2;
          *(double *)(local_298 + lVar9 * 8) = dVar1;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
      }
      local_338.super_Vector<double,_3U>.data_._0_16_ = auVar3;
      OpenMD::MoLocator::placeMol(this_01,(Vector3d *)local_318,&local_338,mol);
      uVar11 = (ulong)(iVar6 + 1);
      pVVar10 = pVVar10 + 1;
    } while (uVar11 <= uVar12 && uVar12 - uVar11 != 0);
  }
  local_2e8 = (undefined1  [16])0x0;
  _local_308 = (undefined1  [16])0x0;
  local_318._8_8_ = 0;
  local_318._0_8_ = ((double)local_278._0_8_ - (double)local_298._0_8_) * 10.0;
  local_2f8._8_8_ = 0;
  local_2f8._0_8_ = ((double)local_278._8_8_ - (double)local_298._8_8_) * 10.0;
  local_2d8 = (local_268 - local_288) * 10.0;
  OpenMD::Snapshot::setHmat(pSVar7->sman_->currentSnapshot_,(Mat3x3d *)local_318);
  this_02 = (DumpWriter *)operator_new(0x60);
  OpenMD::DumpWriter::DumpWriter(this_02,pSVar7,&local_260);
  OpenMD::DumpWriter::writeDump(this_02);
  OpenMD::DumpWriter::~DumpWriter(this_02);
  operator_delete(this_02,0x60);
  snprintf(painCave.errMsg,2000,"A new OpenMD file called \"%s\" has been generated.\n",
           local_260._M_dataplus._M_p);
  painCave.isFatal = 0;
  painCave.severity = 3;
  simError();
  local_2c8._vptr_SimCreator = (_func_int **)&PTR__SimCreator_0022af28;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.mdFileName_._M_dataplus._M_p != &local_2c8.mdFileName_.field_2) {
    operator_delete(local_2c8.mdFileName_._M_dataplus._M_p,
                    CONCAT71(local_2c8.mdFileName_.field_2._M_allocated_capacity._1_7_,
                             local_2c8.mdFileName_.field_2._M_local_buf[0]) + 1);
  }
  if (local_348 != (pointer)0x0) {
    operator_delete(local_348,(long)local_360 - (long)local_348);
  }
  local_220._vptr_SimCreator = (_func_int **)&PTR__SimCreator_0022af28;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.mdFileName_._M_dataplus._M_p != &local_220.mdFileName_.field_2) {
    operator_delete(local_220.mdFileName_._M_dataplus._M_p,
                    CONCAT71(local_220.mdFileName_.field_2._M_allocated_capacity._1_7_,
                             local_220.mdFileName_.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,
                    CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                             local_260.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,
                    CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                             local_240.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  gengetopt_args_info args_info;
  std::string inputFileName;
  std::string outputFileName;

  MoLocator* locator;
  RealType latticeConstant(0.0);
  int nShells(-1);

  DumpWriter* writer;

  // Parse Command Line Arguments
  if (cmdline_parser(argc, argv, &args_info) != 0) exit(1);

  /* get input file name */
  if (args_info.inputs_num)
    inputFileName = args_info.inputs[0];
  else {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "No input .omd file name was specified "
             "on the command line");
    painCave.isFatal = 1;
    cmdline_parser_print_help();
    simError();
  }

  if (args_info.shells_given ||
      (args_info.cuboctahedron_given || args_info.truncatedCube_given)) {
    nShells = args_info.shells_arg;
    if (nShells < 0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "icosahedralBuilder:  The number of shells\n"
               "\tmust be greater than or equal to zero.");
      painCave.isFatal = 1;
      cmdline_parser_print_help();
      simError();
    }
  } else {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "icosahedralBuilder:  The number of shells\n"
             "\tis required to build a Mackay Icosahedron.");
    painCave.isFatal = 1;
    cmdline_parser_print_help();
    simError();
  }

  if (args_info.latticeConstant_given) {
    latticeConstant = args_info.latticeConstant_arg;
  } else {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "icosahedralBuilder:  No lattice constant\n"
             "\tgiven.");
    painCave.isFatal = 1;
    cmdline_parser_print_help();
    simError();
  }

  /* parse md file and set up the system */
  SimCreator oldCreator;
  SimInfo* oldInfo = oldCreator.createSim(inputFileName, false);

  vector<Vector3d> Points;
  if (args_info.ico_given) {
    Icosahedron* ico = new Icosahedron();
    Points           = ico->getPoints(nShells);
  } else if (args_info.deca_given) {
    RegularDecahedron* deca = new RegularDecahedron(nShells);
    Points                  = deca->getPoints();
  } else if (args_info.ino_given) {
    int columnAtoms    = args_info.columnAtoms_arg;
    InoDecahedron* ino = new InoDecahedron(columnAtoms, nShells);
    Points             = ino->getPoints();
  } else if (args_info.marks_given) {
    int columnAtoms   = args_info.columnAtoms_arg;
    int twinAtoms     = args_info.twinAtoms_arg;
    Decahedron* marks = new Decahedron(columnAtoms, nShells, twinAtoms);
    Points            = marks->getPoints();
  } else if (args_info.stone_given) {
    int columnAtoms             = args_info.columnAtoms_arg;
    int twinAtoms               = args_info.twinAtoms_arg;
    int truncatedPlanes         = args_info.truncatedPlanes_arg;
    CurlingStoneDecahedron* csd = new CurlingStoneDecahedron(
        columnAtoms, nShells, twinAtoms, truncatedPlanes);
    Points = csd->getPoints();
  } else if (args_info.cuboctahedron_given || args_info.truncatedCube_given) {
    std::string lattice;
    int unitCells = 0;
    if (args_info.lattice_given) {
      lattice = args_info.lattice_arg;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "icosahedralBuilder: No lattice type given.");
      painCave.isFatal = 1;
      cmdline_parser_print_help();
      simError();
    }
    if (args_info.unitCells_given) {
      unitCells = args_info.unitCells_arg;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "icosahedralBuilder: Must specify unit cells.");
      painCave.isFatal = 1;
      cmdline_parser_print_help();
      simError();
    }
    if (args_info.truncatedCube_given) {
      int truncatedPlanes = args_info.truncatedPlanes_arg;
      TruncatedCube* tc =
          new TruncatedCube(lattice, unitCells, truncatedPlanes);
      Points = tc->getPoints();
    } else {
      RegularCuboctahedron* rc = new RegularCuboctahedron(lattice, unitCells);
      Points                   = rc->getPoints();
    }
  }

  outputFileName = args_info.output_arg;

  // create a new .omd file on fly which corrects the number of
  // molecules

  createMdFile(inputFileName, outputFileName, Points.size());

  delete oldInfo;

  SimCreator newCreator;
  SimInfo* NewInfo = newCreator.createSim(outputFileName, false);

  // Place molecules
  Molecule* mol;
  SimInfo::MoleculeIterator mi;
  mol = NewInfo->beginMolecule(mi);

  int l = 0;

  locator =
      new MoLocator(NewInfo->getMoleculeStamp(0), NewInfo->getForceField());

  Vector3d boxMax;
  Vector3d boxMin;

  for (unsigned int n = 0; n < Points.size(); n++) {
    mol = NewInfo->getMoleculeByGlobalIndex(l);

    Vector3d location;
    if (args_info.cuboctahedron_given || args_info.truncatedCube_given) {
      // The cubic structures are built with a unit spacing between cells
      location = Points[n] * latticeConstant;
    } else {
      // The polyhedra are built with a unit spacing between atoms,
      // which in an FCC lattice should be multiplied by a / sqrt(2).
      location = Points[n] * latticeConstant / sqrt(2.0);
    }
    Vector3d orientation = Vector3d(0, 0, 1.0);

    if (n == 0) {
      boxMax = location;
      boxMin = location;
    } else {
      for (int i = 0; i < 3; i++) {
        boxMax[i] = max(boxMax[i], location[i]);
        boxMin[i] = min(boxMin[i], location[i]);
      }
    }

    locator->placeMol(location, orientation, mol);
    l++;
  }

  Mat3x3d boundingBox;
  boundingBox(0, 0) = 10.0 * (boxMax[0] - boxMin[0]);
  boundingBox(1, 1) = 10.0 * (boxMax[1] - boxMin[1]);
  boundingBox(2, 2) = 10.0 * (boxMax[2] - boxMin[2]);

  // set Hmat
  NewInfo->getSnapshotManager()->getCurrentSnapshot()->setHmat(boundingBox);

  // create dumpwriter and write out the coordinates
  writer = new DumpWriter(NewInfo, outputFileName);

  if (writer == NULL) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Error in creating dumpwriter object ");
    painCave.isFatal = 1;
    simError();
  }

  writer->writeDump();

  // deleting the writer will put the closing at the end of the dump file

  delete writer;

  // clean up by calling simError.....
  snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
           "A new OpenMD file called \"%s\" has been "
           "generated.\n",
           outputFileName.c_str());
  painCave.isFatal  = 0;
  painCave.severity = OPENMD_INFO;
  simError();
  return 0;
}